

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

_Bool dsa_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  mp_int *x;
  mp_int *x_00;
  mp_int *y;
  mp_int *x_01;
  mp_int *exponent;
  mp_int *exponent_00;
  mp_int *x_02;
  mp_int *y_00;
  mp_int *n;
  mp_int *a;
  ptrlen pVar6;
  ptrlen pVar7;
  mp_int *v;
  mp_int *gu1yu2p;
  mp_int *yu2p;
  mp_int *gu1p;
  mp_int *u2;
  mp_int *u1;
  mp_int *sha;
  mp_int *w;
  uint invalid;
  mp_int *s;
  mp_int *r;
  size_t local_a8;
  ptrlen type;
  undefined1 local_88 [7];
  _Bool toret;
  uchar hash [20];
  undefined1 local_68 [8];
  BinarySource src [1];
  dsa_key *dsa;
  ssh_key *key_local;
  ptrlen data_local;
  ptrlen sig_local;
  
  data_local.len = (size_t)sig.ptr;
  src[0].binarysource_ = (BinarySource *)(key + -5);
  if ((ssh_keyalg *)(src[0].binarysource_)->data == (ssh_keyalg *)0x0) {
    sig_local.len._7_1_ = false;
  }
  else {
    BinarySource_INIT__((BinarySource *)local_68,sig);
    if (sig.len != 0x28) {
      pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      pVar7 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      r = (mp_int *)pVar7.ptr;
      data_local.len = (size_t)r;
      local_a8 = pVar7.len;
      if (((*(int *)(src[0]._24_8_ + 0x18) != 0) ||
          (_Var1 = ptrlen_eq_string(pVar6,"ssh-dss"), !_Var1)) || (local_a8 != 0x28)) {
        return false;
      }
    }
    pVar6 = make_ptrlen((void *)data_local.len,0x14);
    x = mp_from_bytes_be(pVar6);
    pVar6 = make_ptrlen((void *)(data_local.len + 0x14),0x14);
    x_00 = mp_from_bytes_be(pVar6);
    if ((x == (mp_int *)0x0) || (x_00 == (mp_int *)0x0)) {
      if (x != (mp_int *)0x0) {
        mp_free(x);
      }
      if (x_00 != (mp_int *)0x0) {
        mp_free(x_00);
      }
      sig_local.len._7_1_ = false;
    }
    else {
      uVar2 = mp_eq_integer(x,0);
      uVar3 = mp_eq_integer(x_00,0);
      uVar4 = mp_cmp_hs(x,(mp_int *)(src[0].binarysource_)->pos);
      uVar5 = mp_cmp_hs(x_00,(mp_int *)(src[0].binarysource_)->pos);
      if (uVar5 == 0 && (uVar4 == 0 && (uVar3 == 0 && uVar2 == 0))) {
        y = mp_invert(x_00,(mp_int *)(src[0].binarysource_)->pos);
        if (y == (mp_int *)0x0) {
          mp_free(x);
          mp_free(x_00);
          sig_local.len._7_1_ = false;
        }
        else {
          hash_simple(&ssh_sha1,data,local_88);
          pVar6 = make_ptrlen(local_88,0x14);
          x_01 = mp_from_bytes_be(pVar6);
          exponent = mp_modmul(x_01,y,(mp_int *)(src[0].binarysource_)->pos);
          exponent_00 = mp_modmul(x,y,(mp_int *)(src[0].binarysource_)->pos);
          x_02 = mp_modpow((mp_int *)(src[0].binarysource_)->len,exponent,
                           (mp_int *)(src[0].binarysource_)->data);
          y_00 = mp_modpow(*(mp_int **)&(src[0].binarysource_)->err,exponent_00,
                           (mp_int *)(src[0].binarysource_)->data);
          n = mp_modmul(x_02,y_00,(mp_int *)(src[0].binarysource_)->data);
          a = mp_mod(n,(mp_int *)(src[0].binarysource_)->pos);
          uVar2 = mp_cmp_eq(a,x);
          sig_local.len._7_1_ = uVar2 != 0;
          mp_free(y);
          mp_free(x_01);
          mp_free(exponent);
          mp_free(exponent_00);
          mp_free(x_02);
          mp_free(y_00);
          mp_free(n);
          mp_free(a);
          mp_free(x);
          mp_free(x_00);
        }
      }
      else {
        mp_free(x);
        mp_free(x_00);
        sig_local.len._7_1_ = false;
      }
    }
  }
  return sig_local.len._7_1_;
}

Assistant:

static bool dsa_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    BinarySource src[1];
    unsigned char hash[20];
    bool toret;

    if (!dsa->p)
        return false;

    BinarySource_BARE_INIT_PL(src, sig);

    /*
     * Commercial SSH (2.0.13) and OpenSSH disagree over the format
     * of a DSA signature. OpenSSH is in line with RFC 4253:
     * it uses a string "ssh-dss", followed by a 40-byte string
     * containing two 160-bit integers end-to-end. Commercial SSH
     * can't be bothered with the header bit, and considers a DSA
     * signature blob to be _just_ the 40-byte string containing
     * the two 160-bit integers. We tell them apart by measuring
     * the length: length 40 means the commercial-SSH bug, anything
     * else is assumed to be RFC-compliant.
     */
    if (sig.len != 40) {      /* bug not present; read admin fields */
        ptrlen type = get_string(src);
        sig = get_string(src);

        if (get_err(src) || !ptrlen_eq_string(type, "ssh-dss") ||
            sig.len != 40)
            return false;
    }

    /* Now we're sitting on a 40-byte string for sure. */
    mp_int *r = mp_from_bytes_be(make_ptrlen(sig.ptr, 20));
    mp_int *s = mp_from_bytes_be(make_ptrlen((const char *)sig.ptr + 20, 20));
    if (!r || !s) {
        if (r)
            mp_free(r);
        if (s)
            mp_free(s);
        return false;
    }

    /* Basic sanity checks: 0 < r,s < q */
    unsigned invalid = 0;
    invalid |= mp_eq_integer(r, 0);
    invalid |= mp_eq_integer(s, 0);
    invalid |= mp_cmp_hs(r, dsa->q);
    invalid |= mp_cmp_hs(s, dsa->q);
    if (invalid) {
        mp_free(r);
        mp_free(s);
        return false;
    }

    /*
     * Step 1. w <- s^-1 mod q.
     */
    mp_int *w = mp_invert(s, dsa->q);
    if (!w) {
        mp_free(r);
        mp_free(s);
        return false;
    }

    /*
     * Step 2. u1 <- SHA(message) * w mod q.
     */
    hash_simple(&ssh_sha1, data, hash);
    mp_int *sha = mp_from_bytes_be(make_ptrlen(hash, 20));
    mp_int *u1 = mp_modmul(sha, w, dsa->q);

    /*
     * Step 3. u2 <- r * w mod q.
     */
    mp_int *u2 = mp_modmul(r, w, dsa->q);

    /*
     * Step 4. v <- (g^u1 * y^u2 mod p) mod q.
     */
    mp_int *gu1p = mp_modpow(dsa->g, u1, dsa->p);
    mp_int *yu2p = mp_modpow(dsa->y, u2, dsa->p);
    mp_int *gu1yu2p = mp_modmul(gu1p, yu2p, dsa->p);
    mp_int *v = mp_mod(gu1yu2p, dsa->q);

    /*
     * Step 5. v should now be equal to r.
     */

    toret = mp_cmp_eq(v, r);

    mp_free(w);
    mp_free(sha);
    mp_free(u1);
    mp_free(u2);
    mp_free(gu1p);
    mp_free(yu2p);
    mp_free(gu1yu2p);
    mp_free(v);
    mp_free(r);
    mp_free(s);

    return toret;
}